

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O1

bool S2::VertexCrossing(S2Point *a,S2Point *b,S2Point *c,S2Point *d)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  long lVar8;
  S2Point *pSVar9;
  double *ap_2;
  double *ap;
  double *ap_1;
  S2Point SStack_38;
  
  dVar2 = a->c_[0];
  dVar3 = b->c_[0];
  if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
    lVar8 = 0;
    do {
      if (lVar8 == 0x10) {
        return false;
      }
      dVar4 = *(double *)((long)a->c_ + lVar8 + 8);
      pdVar1 = (double *)((long)b->c_ + lVar8 + 8);
      lVar8 = lVar8 + 8;
    } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
  }
  dVar4 = c->c_[0];
  dVar5 = d->c_[0];
  if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
    lVar8 = 0;
    do {
      if (lVar8 == 0x10) {
        return false;
      }
      dVar6 = *(double *)((long)c->c_ + lVar8 + 8);
      pdVar1 = (double *)((long)d->c_ + lVar8 + 8);
      lVar8 = lVar8 + 8;
    } while ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1)));
  }
  pSVar9 = a;
  if ((dVar2 == dVar4) && (!NAN(dVar2) && !NAN(dVar4))) {
    lVar8 = 8;
    do {
      if (lVar8 == 0x18) {
        if ((dVar3 == dVar5) && (!NAN(dVar3) && !NAN(dVar5))) {
          lVar8 = 0;
          do {
            if (lVar8 == 0x10) {
              return true;
            }
            dVar2 = *(double *)((long)b->c_ + lVar8 + 8);
            pdVar1 = (double *)((long)d->c_ + lVar8 + 8);
            lVar8 = lVar8 + 8;
          } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
        }
        Ortho(&SStack_38,a);
        c = d;
        goto LAB_001ede1f;
      }
      dVar6 = *(double *)((long)a->c_ + lVar8);
      pdVar1 = (double *)((long)c->c_ + lVar8);
      lVar8 = lVar8 + 8;
    } while ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1)));
  }
  if ((dVar3 == dVar5) && (!NAN(dVar3) && !NAN(dVar5))) {
    lVar8 = 8;
    do {
      if (lVar8 == 0x18) {
        Ortho(&SStack_38,b);
        pSVar9 = b;
        b = a;
        goto LAB_001ede1f;
      }
      dVar6 = *(double *)((long)b->c_ + lVar8);
      pdVar1 = (double *)((long)d->c_ + lVar8);
      lVar8 = lVar8 + 8;
    } while ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1)));
  }
  if ((dVar2 == dVar5) && (!NAN(dVar2) && !NAN(dVar5))) {
    lVar8 = 8;
    do {
      if (lVar8 == 0x18) {
        if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
          lVar8 = 0;
          do {
            if (lVar8 == 0x10) {
              return true;
            }
            dVar2 = *(double *)((long)b->c_ + lVar8 + 8);
            pdVar1 = (double *)((long)c->c_ + lVar8 + 8);
            lVar8 = lVar8 + 8;
          } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
        }
        Ortho(&SStack_38,a);
        goto LAB_001ede1f;
      }
      dVar2 = *(double *)((long)a->c_ + lVar8);
      pdVar1 = (double *)((long)d->c_ + lVar8);
      lVar8 = lVar8 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
  }
  if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
    lVar8 = 8;
    do {
      if (lVar8 == 0x18) {
        Ortho(&SStack_38,b);
        pSVar9 = b;
        b = a;
        c = d;
LAB_001ede1f:
        bVar7 = s2pred::OrderedCCW(&SStack_38,c,b,pSVar9);
        return bVar7;
      }
      dVar2 = *(double *)((long)b->c_ + lVar8);
      pdVar1 = (double *)((long)c->c_ + lVar8);
      lVar8 = lVar8 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&SStack_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
             ,0x61,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)SStack_38.c_[1],"VertexCrossing called with 4 distinct vertices");
  abort();
}

Assistant:

bool VertexCrossing(const S2Point& a, const S2Point& b,
                    const S2Point& c, const S2Point& d) {
  // If A == B or C == D there is no intersection.  We need to check this
  // case first in case 3 or more input points are identical.
  if (a == b || c == d) return false;

  // If any other pair of vertices is equal, there is a crossing if and only
  // if OrderedCCW() indicates that the edge AB is further CCW around the
  // shared vertex O (either A or B) than the edge CD, starting from an
  // arbitrary fixed reference point.
  //
  // Optimization: if AB=CD or AB=DC, we can avoid most of the calculations.
  if (a == c) return (b == d) || s2pred::OrderedCCW(S2::Ortho(a), d, b, a);
  if (b == d) return s2pred::OrderedCCW(S2::Ortho(b), c, a, b);

  if (a == d) return (b == c) || s2pred::OrderedCCW(S2::Ortho(a), c, b, a);
  if (b == c) return s2pred::OrderedCCW(S2::Ortho(b), d, a, b);

  S2_LOG(DFATAL) << "VertexCrossing called with 4 distinct vertices";
  return false;
}